

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall Convolution::convolve(Convolution *this,double *in,int length)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  double *pdVar6;
  double *pdVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  
  if (length <= this->m_filter_len) {
    if (0 < length) {
      pdVar6 = this->m_fft_buff;
      uVar8 = 0;
      do {
        pdVar6[uVar8] = in[uVar8];
        uVar8 = uVar8 + 1;
      } while ((uint)length != uVar8);
    }
    iVar5 = this->m_fft_len;
    if (length < iVar5) {
      memset(this->m_fft_buff + length,0,(ulong)(uint)(~length + iVar5) * 8 + 8);
    }
    rdft(iVar5,1,this->m_fft_buff,this->m_ip,this->m_work);
    pdVar6 = this->m_filter;
    pdVar7 = this->m_fft_buff;
    *pdVar7 = *pdVar6 * *pdVar7;
    pdVar7[1] = pdVar6[1] * pdVar7[1];
    iVar5 = this->m_filter_len;
    if (1 < (long)iVar5) {
      lVar9 = 0;
      do {
        dVar1 = *(double *)((long)pdVar7 + lVar9 + 0x10);
        dVar2 = *(double *)((long)pdVar7 + lVar9 + 0x18);
        dVar3 = *(double *)((long)pdVar6 + lVar9 + 0x10);
        dVar4 = *(double *)((long)pdVar6 + lVar9 + 0x18);
        *(double *)((long)pdVar7 + lVar9 + 0x10) = dVar1 * dVar3 - dVar4 * dVar2;
        *(double *)((long)pdVar7 + lVar9 + 0x18) = dVar1 * dVar4 + dVar3 * dVar2;
        lVar9 = lVar9 + 0x10;
      } while ((long)iVar5 * 0x10 + -0x10 != lVar9);
    }
    rdft(this->m_fft_len,-1,pdVar7,this->m_ip,this->m_work);
    iVar5 = this->m_fft_len;
    if (0 < (long)iVar5) {
      pdVar6 = this->m_fft_buff;
      pdVar7 = this->m_filter_result;
      lVar9 = 0;
      do {
        pdVar7[lVar9] = pdVar6[lVar9] + pdVar7[lVar9];
        lVar9 = lVar9 + 1;
      } while (iVar5 != lVar9);
    }
    if (0 < length) {
      pdVar6 = this->m_filter_result;
      uVar8 = 0;
      do {
        in[uVar8] = pdVar6[uVar8];
        uVar8 = uVar8 + 1;
      } while ((uint)length != uVar8);
    }
    lVar9 = (long)this->m_filter_len;
    if (0 < lVar9) {
      pdVar6 = this->m_filter_result;
      lVar10 = 0;
      do {
        pdVar6[lVar10] = pdVar6[lVar9 + lVar10];
        pdVar6[lVar9 + lVar10] = 0.0;
        lVar10 = lVar10 + 1;
      } while (lVar9 != lVar10);
    }
    return;
  }
  __assert_fail("length <= m_filter_len",
                "/workspace/llm4binary/github/license_c_cmakelists/osoumen[P]dpcmc/main.cpp",0x6c,
                "void Convolution::convolve(double *, int)");
}

Assistant:

void convolve(double *in, int length)
	{
		assert(length <= m_filter_len);
		
		for (int i=0; i<length; ++i) {
			m_fft_buff[i] = in[i];
		}
		for (int i=length; i<m_fft_len; ++i) {
			m_fft_buff[i] = .0;
		}
		rdft(m_fft_len, 1, m_fft_buff, m_ip, m_work);
		m_fft_buff[0] *= m_filter[0];
		m_fft_buff[1] *= m_filter[1];
		for (int i=1; i<m_filter_len; ++i) {
			double realp = m_fft_buff[2*i] * m_filter[2*i] - m_fft_buff[2*i+1] * m_filter[2*i+1];
			double imagp = m_fft_buff[2*i] * m_filter[2*i+1] + m_fft_buff[2*i+1] * m_filter[2*i];
			m_fft_buff[2*i] = realp;
			m_fft_buff[2*i+1] = imagp;
		}
		rdft(m_fft_len, -1, m_fft_buff, m_ip, m_work);
		for (int i=0; i<m_fft_len; ++i) {
			m_filter_result[i] += m_fft_buff[i];
		}
		for (int i=0; i<length; ++i) {
			in[i] = m_filter_result[i];
		}
		for (int i=0; i<m_filter_len; ++i) {
			m_filter_result[i] = m_filter_result[i+m_filter_len];
			m_filter_result[i+m_filter_len] = .0;
		}
	}